

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

WidgetSizePolicy QStyleHelper::widgetSizePolicy(QWidget *widget,QStyleOption *opt)

{
  bool bVar1;
  WidgetSizePolicy WVar2;
  
  if (widget != (QWidget *)0x0) {
    do {
      bVar1 = QWidget::testAttribute_helper(widget,WA_MacMiniSize);
      if (bVar1) {
        return SizeMini;
      }
      bVar1 = QWidget::testAttribute_helper(widget,WA_MacSmallSize);
      if (bVar1) {
        return SizeSmall;
      }
      bVar1 = QWidget::testAttribute_helper(widget,WA_MacNormalSize);
      if (bVar1) {
        return SizeLarge;
      }
      widget = *(QWidget **)(*(long *)&widget->field_0x8 + 0x10);
    } while (widget != (QWidget *)0x0);
  }
  if ((opt == (QStyleOption *)0x0) ||
     ((WVar2 = SizeMini,
      ((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000000) == 0 &&
      ((opt == (QStyleOption *)0x0 ||
       (WVar2 = SizeSmall,
       ((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i & 0x4000000) == 0)))))) {
    WVar2 = SizeDefault;
  }
  return WVar2;
}

Assistant:

WidgetSizePolicy widgetSizePolicy(const QWidget *widget, const QStyleOption *opt)
{
    while (widget) {
        if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return SizeMini;
        } else if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return SizeSmall;
        } else if (widget->testAttribute(Qt::WA_MacNormalSize)) {
            return SizeLarge;
        }
        widget = widget->parentWidget();
    }

    if (opt && opt->state & QStyle::State_Mini)
        return SizeMini;
    else if (opt && opt->state & QStyle::State_Small)
        return SizeSmall;

    return SizeDefault;
}